

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

int __thiscall tetgenmesh::checkconforming(tetgenmesh *this,int flag)

{
  double dVar1;
  double dVar2;
  memorypool *pmVar3;
  void **ppvVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  ulong uVar8;
  tetgenmesh *ptVar9;
  tetgenio *ptVar10;
  undefined1 auVar11 [16];
  bool bVar12;
  uint uVar13;
  void *pvVar14;
  long lVar15;
  uint uVar16;
  tetgenmesh *this_00;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  undefined8 extraout_XMM0_Qb;
  undefined4 uVar23;
  undefined4 uVar24;
  double rhs [4];
  int indx [4];
  double D;
  double A [4] [4];
  uint local_164;
  double local_148;
  double local_140;
  int local_12c;
  double local_128;
  undefined8 uStack_120;
  double local_118 [3];
  double *local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  int local_d8 [6];
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_98;
  double local_90;
  double local_88;
  double local_78;
  double local_70;
  double local_68;
  
  local_164 = 0;
  if ((flag & 1U) != 0) {
    if (this->b->quiet == 0) {
      puts("  Checking conforming property of segments...");
    }
    pmVar3 = this->subsegs;
    ppvVar4 = pmVar3->firstblock;
    pmVar3->pathblock = ppvVar4;
    pmVar3->pathitem =
         (void *)((long)ppvVar4 +
                 (((long)pmVar3->alignbytes + 8U) -
                 (ulong)(ppvVar4 + 1) % (ulong)(long)pmVar3->alignbytes));
    pmVar3->pathitemsleft = pmVar3->itemsperblock;
    do {
      pvVar14 = memorypool::traverse(pmVar3);
      if (pvVar14 == (void *)0x0) {
        pvVar14 = (void *)0x0;
        break;
      }
    } while (*(long *)((long)pvVar14 + 0x18) == 0);
    if (pvVar14 == (void *)0x0) {
      local_164 = 0;
    }
    else {
      local_164 = 0;
      do {
        pdVar5 = *(double **)((long)pvVar14 + 0x18);
        pdVar6 = *(double **)((long)pvVar14 + 0x20);
        dVar20 = (pdVar6[2] - pdVar5[2]) * (pdVar6[2] - pdVar5[2]) +
                 (*pdVar6 - *pdVar5) * (*pdVar6 - *pdVar5) +
                 (pdVar6[1] - pdVar5[1]) * (pdVar6[1] - pdVar5[1]);
        if (dVar20 < 0.0) {
          dVar20 = sqrt(dVar20);
        }
        else {
          dVar20 = SQRT(dVar20);
        }
        lVar15 = 0;
        do {
          local_118[lVar15] = (pdVar5[lVar15] + pdVar6[lVar15]) * 0.5;
          dVar22 = local_118[2];
          dVar2 = local_118[1];
          dVar1 = local_118[0];
          lVar15 = lVar15 + 1;
        } while (lVar15 != 3);
        uVar19 = *(ulong *)((long)pvVar14 + 0x48) & 0xfffffffffffffff0;
        if (uVar19 != 0) {
          uVar13 = (uint)*(ulong *)((long)pvVar14 + 0x48) & 0xf;
          local_128 = local_118[2];
          uVar17 = uVar19;
          do {
            pdVar7 = *(double **)(uVar17 + (long)apexpivot[(int)uVar13] * 8);
            if (pdVar7 != this->dummypoint) {
              dVar21 = (dVar22 - pdVar7[2]) * (dVar22 - pdVar7[2]) +
                       (dVar1 - *pdVar7) * (dVar1 - *pdVar7) +
                       (dVar2 - pdVar7[1]) * (dVar2 - pdVar7[1]);
              if (dVar21 < 0.0) {
                dVar21 = sqrt(dVar21);
              }
              else {
                dVar21 = SQRT(dVar21);
              }
              dVar21 = dVar21 - dVar20 * 0.5;
              if ((dVar21 < 0.0) && (this->b->epsilon < ABS(dVar21) / (dVar20 * 0.5))) {
                printf("  !! !! Non-conforming segment: (%d, %d)\n",
                       (ulong)*(uint *)((long)pdVar5 + (long)this->pointmarkindex * 4),
                       (ulong)*(uint *)((long)pdVar6 + (long)this->pointmarkindex * 4));
                local_164 = local_164 + 1;
                break;
              }
            }
            uVar8 = *(ulong *)(uVar17 + (long)facepivot1[(int)uVar13] * 8);
            uVar17 = uVar8 & 0xfffffffffffffff0;
            uVar13 = facepivot2[(int)uVar13][(uint)uVar8 & 0xf];
          } while (uVar17 != uVar19);
        }
        pmVar3 = this->subsegs;
        do {
          pvVar14 = memorypool::traverse(pmVar3);
          if (pvVar14 == (void *)0x0) {
            pvVar14 = (void *)0x0;
            break;
          }
        } while (*(long *)((long)pvVar14 + 0x18) == 0);
      } while (pvVar14 != (void *)0x0);
    }
    if (local_164 == 0) {
      local_164 = 0;
      if (this->b->quiet == 0) {
        puts("  The segments are conforming Delaunay.");
      }
    }
    else {
      printf("  !! !! %d subsegments are non-conforming.\n",(ulong)local_164);
    }
  }
  local_12c = 0;
  if ((flag & 2U) != 0) {
    if (this->b->quiet == 0) {
      puts("  Checking conforming property of subfaces...");
    }
    ptVar9 = (tetgenmesh *)this->subfaces;
    ptVar10 = ptVar9->in;
    ptVar9->tetrahedrons = (memorypool *)ptVar10;
    ptVar9->subfaces =
         (memorypool *)
         ((long)ptVar10 +
         (((long)*(int *)&ptVar9->subsegs + 8U) -
         (ulong)&ptVar10->useindex % (ulong)(long)*(int *)&ptVar9->subsegs));
    *(int *)((long)&ptVar9->badtetrahedrons + 4) = *(int *)((long)&ptVar9->points + 4);
    do {
      this_00 = ptVar9;
      pvVar14 = memorypool::traverse((memorypool *)ptVar9);
      if (pvVar14 == (void *)0x0) {
        pvVar14 = (void *)0x0;
        break;
      }
    } while (*(long *)((long)pvVar14 + 0x18) == 0);
    if (pvVar14 == (void *)0x0) {
      local_12c = 0;
      local_128 = local_118[0];
    }
    else {
      local_128 = local_118[0];
      local_148 = local_118[1];
      local_140 = local_118[2];
      local_12c = 0;
      uVar13 = 0;
      do {
        pdVar5 = *(double **)((long)pvVar14 + 0x18);
        pdVar6 = *(double **)((long)pvVar14 + 0x20);
        local_100 = *(double **)((long)pvVar14 + 0x28);
        dVar20 = *pdVar5;
        local_b8 = *pdVar6 - dVar20;
        dVar1 = pdVar5[1];
        local_b0 = pdVar6[1] - dVar1;
        dVar2 = pdVar5[2];
        local_a8 = pdVar6[2] - dVar2;
        local_98 = *local_100 - dVar20;
        local_90 = local_100[1] - dVar1;
        local_88 = local_100[2] - dVar2;
        local_78 = local_b0 * local_88 - local_a8 * local_90;
        local_70 = -(local_b8 * local_88 - local_a8 * local_98);
        local_68 = local_b8 * local_90 - local_b0 * local_98;
        local_f8 = (local_a8 * local_a8 + local_b8 * local_b8 + local_b0 * local_b0) * 0.5;
        local_f0 = (local_88 * local_88 + local_98 * local_98 + local_90 * local_90) * 0.5;
        local_e8 = 0.0;
        bVar12 = lu_decmp(this_00,(double (*) [4])&local_b8,3,local_d8,&local_c0,0);
        if (bVar12) {
          lu_solve(this_00,(double (*) [4])&local_b8,3,local_d8,&local_f8,0);
          local_140 = local_e8;
          local_148 = local_f0;
          local_128 = local_f8;
          dVar22 = local_e8 * local_e8 + local_f8 * local_f8 + local_f0 * local_f0;
          if (dVar22 < 0.0) {
            dVar22 = sqrt(dVar22);
            uVar23 = (undefined4)extraout_XMM0_Qb;
            uVar24 = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
          }
          else {
            uVar23 = 0;
            uVar24 = 0;
            dVar22 = SQRT(dVar22);
          }
          local_128 = dVar20 + local_128;
          local_148 = dVar1 + local_148;
          local_140 = dVar2 + local_140;
          iVar18 = 1;
          auVar11._8_4_ = uVar23;
          auVar11._0_8_ = dVar22;
          auVar11._12_4_ = uVar24;
          do {
            uVar19 = *(ulong *)((long)pvVar14 + (ulong)uVar13 * 8 + 0x48);
            uVar16 = (uint)uVar19 & 0xf;
            uVar19 = uVar19 & 0xfffffffffffffff0;
            if (uVar19 != 0) {
              uVar16 = stpivottbl[uVar16][(int)uVar13];
            }
            uStack_120 = auVar11._8_8_;
            if (*(point *)(uVar19 + 0x38) != this->dummypoint) {
              pdVar7 = *(double **)(uVar19 + (long)oppopivot[(int)uVar16] * 8);
              dVar20 = (local_140 - pdVar7[2]) * (local_140 - pdVar7[2]) +
                       (local_128 - *pdVar7) * (local_128 - *pdVar7) +
                       (local_148 - pdVar7[1]) * (local_148 - pdVar7[1]);
              if (dVar20 < 0.0) {
                dVar20 = sqrt(dVar20);
              }
              else {
                dVar20 = SQRT(dVar20);
              }
              uVar19 = -(ulong)(ABS(dVar20 - dVar22) / dVar22 < this->b->epsilon);
              if ((double)(~uVar19 & (ulong)dVar20 | uVar19 & (ulong)dVar22) < dVar22) {
                lVar15 = (long)this->pointmarkindex;
                printf("  !! !! Non-conforming subface: (%d, %d, %d)\n",
                       (ulong)*(uint *)((long)pdVar5 + lVar15 * 4),
                       (ulong)*(uint *)((long)pdVar6 + lVar15 * 4),
                       (ulong)*(uint *)((long)local_100 + lVar15 * 4));
                local_12c = local_12c + 1;
                goto LAB_00152934;
              }
            }
            uVar13 = uVar13 ^ 1;
            iVar18 = iVar18 + -1;
          } while (iVar18 == 0);
        }
LAB_00152934:
        ptVar9 = (tetgenmesh *)this->subfaces;
        do {
          this_00 = ptVar9;
          pvVar14 = memorypool::traverse((memorypool *)ptVar9);
          if (pvVar14 == (void *)0x0) {
            pvVar14 = (void *)0x0;
            break;
          }
        } while (*(long *)((long)pvVar14 + 0x18) == 0);
      } while (pvVar14 != (void *)0x0);
      local_118[1] = local_148;
      local_118[2] = local_140;
    }
    local_118[0] = local_128;
    if (local_12c == 0) {
      local_12c = 0;
      if (this->b->quiet == 0) {
        puts("  The subfaces are conforming Delaunay.");
        local_12c = 0;
      }
    }
    else {
      printf("  !! !! %d subfaces are non-conforming.\n");
    }
  }
  return local_12c + local_164;
}

Assistant:

int tetgenmesh::checkconforming(int flag)
{
  triface searchtet, neightet, spintet;
  face shloop;
  face segloop;
  point eorg, edest, eapex, pa, pb, pc;
  REAL cent[3], radius, dist, diff, rd, len;
  bool enq;
  int encsubsegs, encsubfaces;
  int t1ver; 
  int i;

  REAL A[4][4], rhs[4], D;
  int indx[4];
  REAL elen[3];

  encsubsegs = 0;

  if (flag & 1) {
    if (!b->quiet) {
      printf("  Checking conforming property of segments...\n");
    }
    encsubsegs = 0;

    // Run through the list of subsegments, check each one.
    subsegs->traversalinit();
    segloop.sh = shellfacetraverse(subsegs);
    while (segloop.sh != (shellface *) NULL) {
      eorg = (point) segloop.sh[3];
      edest = (point) segloop.sh[4];
      radius = 0.5 * distance(eorg, edest);
      for (i = 0; i < 3; i++) cent[i] = 0.5 * (eorg[i] + edest[i]);

      enq = false;
      sstpivot1(segloop, neightet);
      if (neightet.tet != NULL) {
        spintet = neightet;
        while (1) {
          eapex= apex(spintet);
          if (eapex != dummypoint) {
            dist = distance(eapex, cent);
            diff = dist - radius;
            if (fabs(diff) / radius <= b->epsilon) diff = 0.0; // Rounding.
            if (diff < 0) {
              enq = true; break;
            }
          }
          fnextself(spintet);
          if (spintet.tet == neightet.tet) break;
        }
      }
      if (enq) {
        printf("  !! !! Non-conforming segment: (%d, %d)\n",
               pointmark(eorg), pointmark(edest));
        encsubsegs++;
      }
      segloop.sh = shellfacetraverse(subsegs);
    }

    if (encsubsegs == 0) {
      if (!b->quiet) {
        printf("  The segments are conforming Delaunay.\n");
      }
    } else {
      printf("  !! !! %d subsegments are non-conforming.\n", encsubsegs);
    }
  } // if (flag & 1)

  encsubfaces = 0;

  if (flag & 2) {
    if (!b->quiet) {
      printf("  Checking conforming property of subfaces...\n");
    }

    // Run through the list of subfaces, check each one.
    subfaces->traversalinit();
    shloop.sh = shellfacetraverse(subfaces);
    while (shloop.sh != (shellface *) NULL) {
      pa = (point) shloop.sh[3];
      pb = (point) shloop.sh[4];
      pc = (point) shloop.sh[5];

      // Compute the coefficient matrix A (3x3).
      A[0][0] = pb[0] - pa[0];
      A[0][1] = pb[1] - pa[1];
      A[0][2] = pb[2] - pa[2]; // vector V1 (pa->pb)
      A[1][0] = pc[0] - pa[0];
      A[1][1] = pc[1] - pa[1];
      A[1][2] = pc[2] - pa[2]; // vector V2 (pa->pc)
      cross(A[0], A[1], A[2]); // vector V3 (V1 X V2)

      // Compute the right hand side vector b (3x1).
      elen[0] = dot(A[0], A[0]);
      elen[1] = dot(A[1], A[1]);
      rhs[0] = 0.5 * elen[0];
      rhs[1] = 0.5 * elen[1];
      rhs[2] = 0.0;

      if (lu_decmp(A, 3, indx, &D, 0)) {
        lu_solve(A, 3, indx, rhs, 0);
        cent[0] = pa[0] + rhs[0];
        cent[1] = pa[1] + rhs[1];
        cent[2] = pa[2] + rhs[2];
        rd = sqrt(rhs[0] * rhs[0] + rhs[1] * rhs[1] + rhs[2] * rhs[2]);

        // Check if this subface is encroached.
        for (i = 0; i < 2; i++) {
          stpivot(shloop, searchtet);
          if (!ishulltet(searchtet)) {
            len = distance(oppo(searchtet), cent);
            if ((fabs(len - rd) / rd) < b->epsilon) len = rd; // Rounding.
            if (len < rd) {
              printf("  !! !! Non-conforming subface: (%d, %d, %d)\n",
                     pointmark(pa), pointmark(pb), pointmark(pc));
              encsubfaces++;
              enq = true; break;
            }
          }
          sesymself(shloop);
        }
      }
      shloop.sh = shellfacetraverse(subfaces);
    }

    if (encsubfaces == 0) {
      if (!b->quiet) {
        printf("  The subfaces are conforming Delaunay.\n");
      }
    } else {
      printf("  !! !! %d subfaces are non-conforming.\n", encsubfaces);
    }
  } // if (flag & 2)

  return encsubsegs + encsubfaces;
}